

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_hv.c
# Opt level: O2

dtl_hv_t * dtl_hv_new(void)

{
  dtl_hv_t *self;
  adt_hash_t *paVar1;
  
  self = (dtl_hv_t *)malloc(0x10);
  if (self != (dtl_hv_t *)0x0) {
    paVar1 = (adt_hash_t *)malloc(0x50);
    self->pAny = paVar1;
    if (paVar1 != (adt_hash_t *)0x0) {
      dtl_hv_create(self);
      return self;
    }
    free(self);
  }
  return (dtl_hv_t *)0x0;
}

Assistant:

dtl_hv_t* dtl_hv_new(void)
{
	dtl_hv_t *self;
	if( (self = (dtl_hv_t*) malloc(sizeof(dtl_hv_t))) == (dtl_hv_t*) 0 )
	{
		return (dtl_hv_t*) 0;
	}
	if( (self->pAny = (adt_hash_t*) malloc(sizeof(adt_hash_t))) == (adt_hash_t*) 0 )
	{
		free(self);
		return (dtl_hv_t*)0;
	}
	dtl_hv_create(self);
	return self;
}